

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pfor.h
# Opt level: O0

uint32_t FastPForLib::PFor::determineBestBase(DATATYPE *in,size_t size)

{
  uint uVar1;
  uint32_t uVar2;
  ulong in_RSI;
  long in_RDI;
  double dVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 in_ZMM1 [64];
  double thiscost;
  double altErate;
  uint32_t b;
  double bestcost;
  double Erate;
  uint32_t numberofexceptions;
  uint32_t bestb;
  uint32_t k_1;
  uint32_t rstart;
  uint32_t k;
  uint32_t freqs [33];
  size_t samplesize;
  size_t defaultsamplesize;
  uint local_104;
  ulong local_100;
  uint local_e4;
  double local_e0;
  double local_d8;
  int local_cc;
  uint32_t local_c8;
  uint local_c4;
  uint local_bc;
  int aiStack_b8 [36];
  ulong local_28;
  undefined8 local_20;
  ulong local_18;
  long local_10;
  uint32_t local_4;
  
  if (in_RSI == 0) {
    local_4 = 0;
  }
  else {
    local_20 = 0x10000;
    local_100 = in_RSI;
    if (0x10000 < in_RSI) {
      local_100 = 0x10000;
    }
    local_28 = local_100;
    for (local_bc = 0; local_bc < 0x21; local_bc = local_bc + 1) {
      aiStack_b8[local_bc] = 0;
    }
    local_10 = in_RDI;
    if (local_100 < in_RSI) {
      local_18 = in_RSI;
      uVar1 = rand();
      local_104 = (uint)((ulong)uVar1 % (local_18 - local_28 & 0xffffffff));
    }
    else {
      local_104 = 0;
    }
    for (local_c4 = local_104; (ulong)local_c4 < local_104 + local_28; local_c4 = local_c4 + 1) {
      uVar2 = asmbits(*(uint32_t *)(local_10 + (ulong)local_c4 * 4));
      aiStack_b8[uVar2] = aiStack_b8[uVar2] + 1;
    }
    local_c8 = 0x20;
    local_cc = 0;
    auVar4 = ZEXT816(0x4040000000000000);
    local_e0 = 32.0;
    for (local_e4 = 0x1f; local_e4 < 0x20; local_e4 = local_e4 - 1) {
      local_cc = aiStack_b8[local_e4 + 1] + local_cc;
      auVar4 = vcvtusi2sd_avx512f(auVar4,local_cc);
      auVar6 = vcvtusi2sd_avx512f(in_ZMM1._0_16_,local_28);
      auVar5._0_8_ = auVar4._0_8_ / auVar6._0_8_;
      auVar5._8_8_ = auVar4._8_8_;
      auVar6 = auVar5;
      local_d8 = auVar5._0_8_;
      if (local_cc != 0) {
        auVar7._8_8_ = 0;
        auVar7._0_8_ = auVar5._0_8_;
        auVar6 = vfmadd213sd_fma(ZEXT816(0x4060000000000000),auVar7,ZEXT816(0xbff0000000000000));
        auVar4 = vcvtusi2sd_avx512f(ZEXT816(0xbff0000000000000),1 << ((byte)local_e4 & 0x1f));
        auVar6._0_8_ = auVar6._0_8_ / (auVar5._0_8_ * auVar4._0_8_);
        if (auVar5._0_8_ < auVar6._0_8_) {
          local_d8 = auVar6._0_8_;
        }
        auVar6._8_8_ = 0;
      }
      auVar4 = vcvtusi2sd_avx512f(auVar6,local_e4);
      auVar8._8_8_ = 0;
      auVar8._0_8_ = local_d8;
      auVar4 = vfmadd213sd_fma(ZEXT816(0x4040000000000000),auVar8,auVar4);
      dVar3 = auVar4._0_8_;
      in_ZMM1 = ZEXT864((ulong)dVar3);
      if (dVar3 <= local_e0) {
        local_c8 = local_e4;
        local_e0 = dVar3;
      }
      auVar4._8_8_ = 0;
      auVar4._0_8_ = local_e0;
    }
    local_4 = local_c8;
  }
  return local_4;
}

Assistant:

static uint32_t determineBestBase(const DATATYPE *in, size_t size) {
    if (size == 0)
      return 0;
    const size_t defaultsamplesize = 64 * 1024;
    // the original paper describes sorting
    // a sample, but this only makes sense if you
    // are coding a frame of reference.
    size_t samplesize = size > defaultsamplesize ? defaultsamplesize : size;
    uint32_t freqs[33];
    for (uint32_t k = 0; k <= 32; ++k)
      freqs[k] = 0;
    // we choose the sample to be consecutive
    uint32_t rstart =
        size > samplesize
            ? (rand() % (static_cast<uint32_t>(size - samplesize)))
            : 0U;
    for (uint32_t k = rstart; k < rstart + samplesize; ++k) {
      freqs[asmbits(in[k])]++;
    }
    uint32_t bestb = 32;
    uint32_t numberofexceptions = 0;
    double Erate = 0;
    double bestcost = 32;
    for (uint32_t b = bestb - 1; b < 32; --b) {
      numberofexceptions += freqs[b + 1];
      Erate = static_cast<double>(numberofexceptions) /
              static_cast<double>(samplesize);
      /**
      * though this is not explicit in the original paper, you
      * need to somehow compensate for compulsory exceptions
      * when the chosen number of bits is small.
      *
      * We use their formula (3.1.5) to estimate actual number
      * of total exceptions, including compulsory exceptions.
      */
      if (numberofexceptions > 0) {
        double altErate = (Erate * 128 - 1) / (Erate * (1U << b));
        if (altErate > Erate)
          Erate = altErate;
      }
      const double thiscost = b + Erate * 32;
      if (thiscost <= bestcost) {
        bestcost = thiscost;
        bestb = b;
      }
    }
    return bestb;
  }